

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O2

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::Initialize
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this)

{
  SubsList *pSVar1;
  ostream *poVar2;
  int iVar3;
  _List_node_base *p_Var4;
  TPZFMatrix<double> diag;
  TPZFMatrix<double> diaglocal;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of substructures ");
  pSVar1 = &this->fGlobal;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  tempo.fNumSub =
       (int)(this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
            ._M_impl._M_node._M_size;
  diaglocal.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix
            (&diag,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,1,(double *)&diaglocal);
  iVar3 = 0;
  p_Var4 = (_List_node_base *)pSVar1;
  while (p_Var4 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)pSVar1) {
    TPZFMatrix<double>::TPZFMatrix(&diaglocal);
    TPZDohrSubstructCondense<double>::ContributeDiagonalLocal
              (*(TPZDohrSubstructCondense<double> **)p_Var4[1]._M_next,&diaglocal);
    TPZDohrAssembly<double>::Assemble(((this->fAssembly).fRef)->fPointer,iVar3,&diaglocal,&diag);
    std::operator<<((ostream *)&std::cout,'*');
    std::ostream::flush();
    TPZFMatrix<double>::~TPZFMatrix(&diaglocal);
    iVar3 = iVar3 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  iVar3 = 0;
  p_Var4 = (_List_node_base *)pSVar1;
  while (p_Var4 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)pSVar1) {
    TPZFMatrix<double>::TPZFMatrix(&diaglocal);
    TPZDohrAssembly<double>::Extract(((this->fAssembly).fRef)->fPointer,iVar3,&diag,&diaglocal);
    TPZDohrSubstructCondense<double>::ComputeWeightsLocal
              (*(TPZDohrSubstructCondense<double> **)p_Var4[1]._M_next,&diaglocal);
    TPZFMatrix<double>::~TPZFMatrix(&diaglocal);
    iVar3 = iVar3 + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix(&diag);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct>::Initialize() 
{
	std::cout << "Number of substructures " << fGlobal.size() << std::endl;
	tempo.fNumSub = fGlobal.size();																// alimenta timeTemp com o numero de substruturas
	TPZFMatrix<TVar> diag(this->Rows(),1,0.);
	typename SubsList::iterator iter;
	int isub = 0;
	for (iter=fGlobal.begin();iter!=fGlobal.end();iter++,isub++) {
        //Basic initialization for each substructure (compute the matrices)
        //(*iter)->Initialize();
		TPZFMatrix<TVar> diaglocal;
        (*iter)->ContributeDiagonalLocal(diaglocal);
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            LOGPZ_DEBUG(logger,"Before assemble diagonal")
        }
#endif
		this->fAssembly->Assemble(isub,diaglocal,diag);
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Substructure " << isub << " ";
			diag.Print("Global Diagonal matrix",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
        std::cout << '*';
        std::cout.flush();
	}
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		diag.Print("Global Diagonal matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << std::endl;
	for (iter=fGlobal.begin(),isub=0;iter!=fGlobal.end();iter++,isub++) {
        //Computes the Weights for each substructure
		TPZFMatrix<TVar> diaglocal;
		this->fAssembly->Extract(isub,diag,diaglocal);
        (*iter)->ComputeWeightsLocal(diaglocal);
		
	}
}